

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_18f5b::AppImpl::frame(AppImpl *this)

{
  wchar_t width;
  wchar_t height;
  __enable_if_is_duration<std::chrono::duration<unsigned_int,_std::ratio<1L,_1000L>_>_> _Var1;
  element_type *peVar2;
  rep_conflict rVar3;
  wchar_t local_48;
  __enable_if_is_duration<std::chrono::duration<unsigned_int,_std::ratio<1L,_1000L>_>_> dtms;
  ivec2 screen;
  __enable_if_is_duration<std::chrono::duration<float>_> dtsec;
  type dt;
  time_point now;
  AppImpl *this_local;
  
  checkForStateChange(this);
  dt.__r = std::chrono::_V2::steady_clock::now();
  register0x00000000 =
       std::chrono::operator-
                 ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   *)&dt,&this->m_time);
  screen.x = (int)std::chrono::
                  duration_cast<std::chrono::duration<float,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                            ((duration<long,_std::ratio<1L,_1000000000L>_> *)&screen.y);
  rVar3 = std::chrono::duration<float,_std::ratio<1L,_1L>_>::count
                    ((duration<float,_std::ratio<1L,_1L>_> *)&screen);
  if (1e-05 <= rVar3) {
    (this->m_time).__d.__r = dt.__r;
    width = sapp_width();
    height = sapp_height();
    local_48 = width;
    dtms.__r = height;
    std::chrono::duration<float,_std::ratio<1L,_1L>_>::count
              ((duration<float,_std::ratio<1L,_1L>_> *)&screen);
    sapp_dpi_scale();
    simgui_new_frame((simgui_frame_desc_t *)&stack0xffffffffffffffb8);
    _Var1 = std::chrono::
            duration_cast<std::chrono::duration<unsigned_int,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)&screen.y);
    peVar2 = std::__shared_ptr_access<AppState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<AppState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->m_state);
    (*peVar2->_vptr_AppState[4])(peVar2,(ulong)_Var1.__r,CONCAT44(height,width));
    sg_begin_default_pass(&this->m_defaultPassAction,width,height);
    peVar2 = std::__shared_ptr_access<AppState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<AppState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->m_state);
    (*peVar2->_vptr_AppState[5])(peVar2,CONCAT44(height,width));
    simgui_render();
    sg_end_pass();
    sg_commit();
  }
  return;
}

Assistant:

void frame()
    {
        checkForStateChange();

        auto now = clock::now();
        auto dt = now - m_time;
        auto dtsec = std::chrono::duration_cast<sec_t>(dt);

        // too short frame to care
        if (dtsec.count() < yama::constants::EPSILON) return;

        m_time = now;

        ivec2 screen = {sapp_width(), sapp_height()};

        simgui_new_frame(simgui_frame_desc_t{
            .width = screen.x,
            .height = screen.y,
            .delta_time = dtsec.count(),
            .dpi_scale = sapp_dpi_scale()
        });

        auto dtms = std::chrono::duration_cast<ms_t>(dt);
        m_state->update(dtms, screen);

        sg_begin_default_pass(&m_defaultPassAction, screen.x, screen.y);
        m_state->defaultRender(screen);
        simgui_render();
        sg_end_pass();
        sg_commit();
    }